

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assignPWproduct4setup<double,double>
          (SSVectorBase<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  clear(this);
  this->setupStatus = false;
  uVar1 = (x->super_IdxSet).num;
  uVar2 = (y->super_IdxSet).num;
  if (0 < (long)(int)uVar2 && 0 < (long)(int)uVar1) {
    lVar13 = (long)(int)uVar1 + -1;
    lVar9 = (long)(int)uVar2 + -1;
    piVar3 = (x->super_IdxSet).idx;
    iVar10 = *piVar3;
    piVar4 = (y->super_IdxSet).idx;
    iVar14 = *piVar4;
    iVar15 = 0;
    iVar12 = (int)lVar13;
    iVar8 = (int)lVar9;
    if (uVar2 < 2 || uVar1 < 2) {
      iVar16 = 0;
    }
    else {
      pdVar5 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (y->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar7 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar16 = 0;
      iVar15 = 0;
      do {
        if (iVar10 == iVar14) {
          pdVar7[iVar14] = pdVar5[iVar14] * pdVar6[iVar14];
          lVar11 = (long)iVar16;
          iVar16 = iVar16 + 1;
          iVar10 = piVar3[lVar11 + 1];
LAB_0022b6b8:
          lVar11 = (long)iVar15;
          iVar15 = iVar15 + 1;
          iVar14 = piVar4[lVar11 + 1];
        }
        else {
          if (iVar14 <= iVar10) goto LAB_0022b6b8;
          lVar11 = (long)iVar16;
          iVar16 = iVar16 + 1;
          iVar10 = piVar3[lVar11 + 1];
        }
      } while ((iVar16 < iVar12) && (iVar15 < iVar8));
    }
    if ((iVar16 < iVar12) && (iVar10 != iVar14)) {
      lVar11 = (long)iVar16;
      do {
        lVar11 = lVar11 + 1;
        iVar10 = piVar3[lVar11];
        if (lVar13 <= lVar11) break;
      } while (iVar10 != iVar14);
    }
    if ((iVar15 < iVar8) && (iVar10 != iVar14)) {
      lVar13 = (long)iVar15;
      do {
        lVar13 = lVar13 + 1;
        iVar14 = piVar4[lVar13];
        if (lVar9 <= lVar13) break;
      } while (iVar10 != iVar14);
    }
    if (iVar10 == iVar14) {
      (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar10] =
           (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar10] *
           (y->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar10];
    }
  }
  setup(this);
  return this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assignPWproduct4setup(const SSVectorBase<S>& x,
      const SSVectorBase<T>& y)
{
   assert(dim() == x.dim());
   assert(x.dim() == y.dim());
   assert(x.isSetup());
   assert(y.isSetup());

   clear();
   setupStatus = false;

   int i = 0;
   int j = 0;
   int n = x.size() - 1;
   int m = y.size() - 1;

   /* both x and y non-zero vectors? */
   if(m >= 0 && n >= 0)
   {
      int xi = x.index(i);
      int yj = y.index(j);

      while(i < n && j < m)
      {
         if(xi == yj)
         {
            VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
            xi = x.index(++i);
            yj = y.index(++j);
         }
         else if(xi < yj)
            xi = x.index(++i);
         else
            yj = y.index(++j);
      }

      /* check (possible) remaining indices */

      while(i < n && xi != yj)
         xi = x.index(++i);

      while(j < m && xi != yj)
         yj = y.index(++j);

      if(xi == yj)
         VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
   }

   setup();

   assert(isConsistent());

   return *this;
}